

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mining.cpp
# Opt level: O0

bool GenerateBlock(ChainstateManager *chainman,Mining *miner,CBlock *block,uint64_t *max_tries,
                  shared_ptr<const_CBlock> *block_out,bool process_new_block)

{
  uint256 hash;
  byte bVar1;
  bool bVar2;
  uint uVar3;
  uint uVar4;
  ulong uVar5;
  undefined8 uVar6;
  long *in_RCX;
  long in_RDX;
  long *in_RSI;
  undefined8 in_R8;
  byte in_R9B;
  long in_FS_OFFSET;
  ChainstateManager *in_stack_fffffffffffffee8;
  shared_ptr<const_CBlock> *in_stack_fffffffffffffef0;
  __shared_ptr<const_CBlock,_(__gnu_cxx::_Lock_policy)2> *in_stack_fffffffffffffef8;
  CBlockHeader *in_stack_ffffffffffffff08;
  Params *in_stack_ffffffffffffff10;
  undefined4 in_stack_ffffffffffffff18;
  uint in_stack_ffffffffffffff1c;
  string *message;
  undefined4 in_stack_ffffffffffffff30;
  undefined4 in_stack_ffffffffffffff38;
  uint in_stack_ffffffffffffff3c;
  undefined2 in_stack_ffffffffffffff40;
  undefined1 in_stack_ffffffffffffff42;
  byte bVar7;
  undefined1 in_stack_ffffffffffffff43;
  undefined4 in_stack_ffffffffffffff44;
  CBlock *in_stack_ffffffffffffff48;
  undefined7 in_stack_ffffffffffffff50;
  bool local_7a;
  string local_79;
  ChainstateManager *local_48;
  shared_ptr<const_CBlock> *local_40;
  __shared_ptr<const_CBlock,_(__gnu_cxx::_Lock_policy)2> *local_38;
  undefined8 local_28;
  undefined8 local_20;
  undefined8 local_18;
  undefined8 local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  bVar1 = in_R9B & 1;
  std::__shared_ptr<const_CBlock,_(__gnu_cxx::_Lock_policy)2>::reset(in_stack_fffffffffffffef8);
  BlockMerkleRoot(in_stack_ffffffffffffff48,
                  (bool *)CONCAT44(in_stack_ffffffffffffff44,
                                   CONCAT13(in_stack_ffffffffffffff43,
                                            CONCAT12(in_stack_ffffffffffffff42,
                                                     in_stack_ffffffffffffff40))));
  *(undefined8 *)(in_RDX + 0x24) = local_28;
  *(undefined8 *)(in_RDX + 0x2c) = local_20;
  *(undefined8 *)(in_RDX + 0x34) = local_18;
  *(undefined8 *)(in_RDX + 0x3c) = local_10;
  while( true ) {
    bVar7 = 0;
    if (*in_RCX != 0) {
      in_stack_ffffffffffffff3c = *(uint *)(in_RDX + 0x4c);
      uVar3 = std::numeric_limits<unsigned_int>::max();
      bVar7 = 0;
      if (in_stack_ffffffffffffff3c < uVar3) {
        CBlockHeader::GetHash(in_stack_ffffffffffffff08);
        in_stack_ffffffffffffff38 = *(undefined4 *)(in_RDX + 0x48);
        ChainstateManager::GetConsensus(in_stack_fffffffffffffee8);
        hash.super_base_blob<256U>.m_data._M_elems[7] = bVar1;
        hash.super_base_blob<256U>.m_data._M_elems[0] = (char)in_stack_ffffffffffffff50;
        hash.super_base_blob<256U>.m_data._M_elems[1] =
             (char)((uint7)in_stack_ffffffffffffff50 >> 8);
        hash.super_base_blob<256U>.m_data._M_elems[2] =
             (char)((uint7)in_stack_ffffffffffffff50 >> 0x10);
        hash.super_base_blob<256U>.m_data._M_elems[3] =
             (char)((uint7)in_stack_ffffffffffffff50 >> 0x18);
        hash.super_base_blob<256U>.m_data._M_elems[4] =
             (char)((uint7)in_stack_ffffffffffffff50 >> 0x20);
        hash.super_base_blob<256U>.m_data._M_elems[5] =
             (char)((uint7)in_stack_ffffffffffffff50 >> 0x28);
        hash.super_base_blob<256U>.m_data._M_elems[6] =
             (char)((uint7)in_stack_ffffffffffffff50 >> 0x30);
        hash.super_base_blob<256U>.m_data._M_elems[8] = (char)in_R8;
        hash.super_base_blob<256U>.m_data._M_elems[9] = (char)((ulong)in_R8 >> 8);
        hash.super_base_blob<256U>.m_data._M_elems[10] = (char)((ulong)in_R8 >> 0x10);
        hash.super_base_blob<256U>.m_data._M_elems[0xb] = (char)((ulong)in_R8 >> 0x18);
        hash.super_base_blob<256U>.m_data._M_elems[0xc] = (char)((ulong)in_R8 >> 0x20);
        hash.super_base_blob<256U>.m_data._M_elems[0xd] = (char)((ulong)in_R8 >> 0x28);
        hash.super_base_blob<256U>.m_data._M_elems[0xe] = (char)((ulong)in_R8 >> 0x30);
        hash.super_base_blob<256U>.m_data._M_elems[0xf] = (char)((ulong)in_R8 >> 0x38);
        hash.super_base_blob<256U>.m_data._M_elems._16_8_ = in_RCX;
        hash.super_base_blob<256U>.m_data._M_elems[0x18] = (char)in_RDX;
        hash.super_base_blob<256U>.m_data._M_elems[0x19] = (char)((ulong)in_RDX >> 8);
        hash.super_base_blob<256U>.m_data._M_elems[0x1a] = (char)((ulong)in_RDX >> 0x10);
        hash.super_base_blob<256U>.m_data._M_elems[0x1b] = (char)((ulong)in_RDX >> 0x18);
        hash.super_base_blob<256U>.m_data._M_elems[0x1c] = (char)((ulong)in_RDX >> 0x20);
        hash.super_base_blob<256U>.m_data._M_elems[0x1d] = (char)((ulong)in_RDX >> 0x28);
        hash.super_base_blob<256U>.m_data._M_elems[0x1e] = (char)((ulong)in_RDX >> 0x30);
        hash.super_base_blob<256U>.m_data._M_elems[0x1f] = (char)((ulong)in_RDX >> 0x38);
        in_stack_fffffffffffffee8 = local_48;
        in_stack_fffffffffffffef0 = local_40;
        in_stack_fffffffffffffef8 = local_38;
        bVar2 = CheckProofOfWork(hash,in_stack_ffffffffffffff1c,in_stack_ffffffffffffff10);
        bVar7 = 0;
        if (!bVar2) {
          bVar2 = util::SignalInterrupt::operator_cast_to_bool
                            ((SignalInterrupt *)in_stack_fffffffffffffee8);
          bVar7 = bVar2 ^ 0xff;
        }
      }
    }
    if ((bVar7 & 1) == 0) break;
    *(int *)(in_RDX + 0x4c) = *(int *)(in_RDX + 0x4c) + 1;
    *in_RCX = *in_RCX + -1;
  }
  if (*in_RCX == 0) {
LAB_0133810d:
    local_7a = false;
  }
  else {
    bVar2 = util::SignalInterrupt::operator_cast_to_bool
                      ((SignalInterrupt *)in_stack_fffffffffffffee8);
    if (bVar2) goto LAB_0133810d;
    uVar3 = *(uint *)(in_RDX + 0x4c);
    uVar4 = std::numeric_limits<unsigned_int>::max();
    if (uVar3 == uVar4) {
      local_7a = true;
    }
    else {
      std::make_shared<CBlock_const,CBlock>
                ((CBlock *)CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18));
      std::shared_ptr<const_CBlock>::operator=
                ((shared_ptr<const_CBlock> *)in_stack_fffffffffffffef8,in_stack_fffffffffffffef0);
      std::shared_ptr<const_CBlock>::~shared_ptr
                ((shared_ptr<const_CBlock> *)in_stack_fffffffffffffee8);
      if ((bVar1 & 1) == 0) {
        local_7a = true;
      }
      else {
        uVar5 = (**(code **)(*in_RSI + 0x38))(in_RSI,in_R8,0);
        if ((uVar5 & 1) == 0) {
          uVar6 = __cxa_allocate_exception(0x58);
          message = &local_79;
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38),
                     (char *)CONCAT44(uVar3,in_stack_ffffffffffffff30),(allocator<char> *)message);
          JSONRPCError(in_stack_ffffffffffffff3c,message);
          if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
            __cxa_throw(uVar6,&UniValue::typeinfo,UniValue::~UniValue);
          }
          goto LAB_013382f8;
        }
        local_7a = true;
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return local_7a;
  }
LAB_013382f8:
  __stack_chk_fail();
}

Assistant:

static bool GenerateBlock(ChainstateManager& chainman, Mining& miner, CBlock&& block, uint64_t& max_tries, std::shared_ptr<const CBlock>& block_out, bool process_new_block)
{
    block_out.reset();
    block.hashMerkleRoot = BlockMerkleRoot(block);

    while (max_tries > 0 && block.nNonce < std::numeric_limits<uint32_t>::max() && !CheckProofOfWork(block.GetHash(), block.nBits, chainman.GetConsensus()) && !chainman.m_interrupt) {
        ++block.nNonce;
        --max_tries;
    }
    if (max_tries == 0 || chainman.m_interrupt) {
        return false;
    }
    if (block.nNonce == std::numeric_limits<uint32_t>::max()) {
        return true;
    }

    block_out = std::make_shared<const CBlock>(std::move(block));

    if (!process_new_block) return true;

    if (!miner.processNewBlock(block_out, nullptr)) {
        throw JSONRPCError(RPC_INTERNAL_ERROR, "ProcessNewBlock, block not accepted");
    }

    return true;
}